

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

Vec_Str_t * Lms_GiaSuppSizes(Gia_Man_t *p)

{
  char cVar1;
  char cVar2;
  undefined1 uVar3;
  uint *__ptr;
  undefined1 *puVar4;
  void *pvVar5;
  Vec_Str_t *pVVar6;
  char *pcVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  Vec_Int_t *pVVar16;
  size_t sVar17;
  uint *local_40;
  
  uVar13 = p->nObjs;
  __ptr = (uint *)malloc(0x10);
  uVar14 = 0x10;
  if (0xe < uVar13 - 1) {
    uVar14 = uVar13;
  }
  *__ptr = uVar14;
  if (uVar14 == 0) {
    puVar4 = (undefined1 *)malloc(0x10);
    *(undefined1 **)(__ptr + 2) = puVar4;
    *__ptr = 0x10;
  }
  else {
    puVar4 = (undefined1 *)malloc((long)(int)uVar14);
    *(undefined1 **)(__ptr + 2) = puVar4;
  }
  local_40 = __ptr + 2;
  __ptr[1] = 1;
  *puVar4 = 0;
  uVar14 = 1;
  if (1 < (int)uVar13) {
    lVar12 = 1;
    lVar11 = 0xc;
    do {
      uVar15 = *(ulong *)(&p->pObjs->field_0x0 + lVar11);
      uVar13 = (uint)uVar15;
      if ((uVar15 & 0x1fffffff) == 0x1fffffff || (int)uVar13 < 0) {
        if ((int)uVar13 < 0 && (int)(uVar15 & 0x1fffffff) != 0x1fffffff) {
          uVar15 = (ulong)-(uVar13 & 0x1fffffff) + lVar12;
          iVar8 = (int)uVar15;
          if (iVar8 < 0) goto LAB_002f64c6;
          uVar13 = __ptr[1];
          if ((int)uVar13 <= iVar8) goto LAB_002f64c6;
          pvVar5 = *(void **)(__ptr + 2);
          uVar3 = *(undefined1 *)((long)pvVar5 + (uVar15 & 0xffffffff));
          if (uVar13 == *__ptr) {
            if (uVar13 < 0x10) {
              pvVar5 = realloc(pvVar5,0x10);
              sVar17 = 0x10;
            }
            else {
              sVar17 = (ulong)uVar13 * 2;
              pvVar5 = realloc(pvVar5,sVar17);
            }
            *(void **)(__ptr + 2) = pvVar5;
            *__ptr = (uint)sVar17;
          }
          __ptr[1] = uVar13 + 1;
          *(undefined1 *)((long)pvVar5 + (ulong)uVar13) = uVar3;
        }
        else {
          if ((~uVar13 & 0x9fffffff) != 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                          ,0xe7,"Vec_Str_t *Lms_GiaSuppSizes(Gia_Man_t *)");
          }
          if (-1 < (int)uVar13) {
            __assert_fail("pObj->fTerm",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1da,"int Gia_ObjCioId(Gia_Obj_t *)");
          }
          uVar13 = __ptr[1];
          if (uVar13 == *__ptr) {
            if ((int)uVar13 < 0x10) {
              if (*(void **)local_40 == (void *)0x0) {
                pvVar5 = malloc(0x10);
              }
              else {
                pvVar5 = realloc(*(void **)local_40,0x10);
              }
              *(void **)(__ptr + 2) = pvVar5;
              *__ptr = 0x10;
            }
            else {
              sVar17 = (ulong)uVar13 * 2;
              if (*(void **)local_40 == (void *)0x0) {
                pvVar5 = malloc(sVar17);
              }
              else {
                pvVar5 = realloc(*(void **)local_40,sVar17);
              }
              *(void **)(__ptr + 2) = pvVar5;
              *__ptr = (uint)sVar17;
            }
          }
          else {
            pvVar5 = *(void **)local_40;
          }
          __ptr[1] = uVar13 + 1;
          *(char *)((long)pvVar5 + (long)(int)uVar13) = (char)(uVar15 >> 0x20) + '\x01';
        }
      }
      else {
        uVar10 = (ulong)-(uVar13 & 0x1fffffff) + lVar12;
        iVar8 = (int)uVar10;
        if (iVar8 < 0) goto LAB_002f64c6;
        uVar13 = __ptr[1];
        if ((int)uVar13 <= iVar8) goto LAB_002f64c6;
        uVar15 = (ulong)-((uint)(uVar15 >> 0x20) & 0x1fffffff) + lVar12;
        uVar14 = (uint)uVar15;
        if (((int)uVar14 < 0) || (uVar13 <= uVar14)) goto LAB_002f64c6;
        pvVar5 = *(void **)local_40;
        cVar1 = *(char *)((long)pvVar5 + (uVar10 & 0xffffffff));
        cVar2 = *(char *)((long)pvVar5 + (uVar15 & 0xffffffff));
        if (cVar2 < cVar1) {
          cVar2 = cVar1;
        }
        if (uVar13 == *__ptr) {
          if (uVar13 < 0x10) {
            pvVar5 = realloc(pvVar5,0x10);
            sVar17 = 0x10;
          }
          else {
            sVar17 = (ulong)uVar13 * 2;
            pvVar5 = realloc(pvVar5,sVar17);
          }
          *(void **)(__ptr + 2) = pvVar5;
          *__ptr = (uint)sVar17;
        }
        __ptr[1] = uVar13 + 1;
        *(char *)((long)pvVar5 + (ulong)uVar13) = cVar2;
      }
      lVar12 = lVar12 + 1;
      uVar13 = p->nObjs;
      lVar11 = lVar11 + 0xc;
    } while (lVar12 < (int)uVar13);
    uVar14 = __ptr[1];
  }
  if (uVar14 != uVar13) {
    __assert_fail("Vec_StrSize(vSupps) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcRec3.c"
                  ,0xe9,"Vec_Str_t *Lms_GiaSuppSizes(Gia_Man_t *)");
  }
  pVVar16 = p->vCos;
  iVar8 = pVVar16->nSize;
  pVVar6 = (Vec_Str_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar9 = iVar8;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar9;
  if (iVar9 == 0) {
    pcVar7 = (char *)0x0;
  }
  else {
    pcVar7 = (char *)malloc((long)iVar9);
  }
  pVVar6->pArray = pcVar7;
  if (0 < iVar8) {
    lVar11 = 0;
    do {
      iVar8 = pVVar16->pArray[lVar11];
      if (((long)iVar8 < 0) || (p->nObjs <= iVar8)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((int)__ptr[1] <= iVar8) {
LAB_002f64c6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      cVar1 = *(char *)(*(long *)local_40 + (long)iVar8);
      uVar13 = pVVar6->nSize;
      if (uVar13 == pVVar6->nCap) {
        if ((int)uVar13 < 0x10) {
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,0x10);
          }
          pVVar6->pArray = pcVar7;
          pVVar6->nCap = 0x10;
        }
        else {
          sVar17 = (ulong)uVar13 * 2;
          if (pVVar6->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar17);
          }
          else {
            pcVar7 = (char *)realloc(pVVar6->pArray,sVar17);
          }
          pVVar6->pArray = pcVar7;
          pVVar6->nCap = (int)sVar17;
        }
      }
      else {
        pcVar7 = pVVar6->pArray;
      }
      pVVar6->nSize = uVar13 + 1;
      pcVar7[(int)uVar13] = cVar1;
      lVar11 = lVar11 + 1;
      pVVar16 = p->vCos;
    } while (lVar11 < pVVar16->nSize);
  }
  if (*(void **)local_40 != (void *)0x0) {
    free(*(void **)local_40);
  }
  free(__ptr);
  return pVVar6;
}

Assistant:

Vec_Str_t * Lms_GiaSuppSizes( Gia_Man_t * p )
{
    Vec_Str_t * vResult;
    Vec_Str_t * vSupps;
    Gia_Obj_t * pObj;
    int i;
    vSupps = Vec_StrAlloc( Gia_ManObjNum(p) );
    Vec_StrPush( vSupps, 0 );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Vec_StrPush( vSupps, (char)Abc_MaxInt( Vec_StrEntry(vSupps, Gia_ObjFaninId0(pObj, i)), Vec_StrEntry(vSupps, Gia_ObjFaninId1(pObj, i)) ) );
        else if ( Gia_ObjIsCo(pObj) )
            Vec_StrPush( vSupps, Vec_StrEntry(vSupps, Gia_ObjFaninId0(pObj, i)) );
        else if ( Gia_ObjIsCi(pObj) )
            Vec_StrPush( vSupps, (char)(Gia_ObjCioId(pObj)+1) );
        else assert( 0 );
    }
    assert( Vec_StrSize(vSupps) == Gia_ManObjNum(p) );
    vResult = Vec_StrAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_StrPush( vResult, Vec_StrEntry(vSupps, Gia_ObjId(p, pObj)) );
    Vec_StrFree( vSupps );
    return vResult;
}